

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.c
# Opt level: O0

void aom_highbd_subtract_block_c
               (int rows,int cols,int16_t *diff,ptrdiff_t diff_stride,uint8_t *src8,
               ptrdiff_t src_stride,uint8_t *pred8,ptrdiff_t pred_stride)

{
  uint16_t *pred;
  uint16_t *src;
  int c;
  int r;
  ptrdiff_t src_stride_local;
  uint8_t *src8_local;
  ptrdiff_t diff_stride_local;
  int16_t *diff_local;
  int cols_local;
  int rows_local;
  
  src = (uint16_t *)((long)src8 << 1);
  pred = (uint16_t *)((long)pred8 << 1);
  diff_local = diff;
  for (r = 0; r < rows; r = r + 1) {
    for (c = 0; c < cols; c = c + 1) {
      diff_local[c] = src[c] - pred[c];
    }
    diff_local = diff_local + diff_stride;
    pred = pred + pred_stride;
    src = src + src_stride;
  }
  return;
}

Assistant:

void aom_highbd_subtract_block_c(int rows, int cols, int16_t *diff,
                                 ptrdiff_t diff_stride, const uint8_t *src8,
                                 ptrdiff_t src_stride, const uint8_t *pred8,
                                 ptrdiff_t pred_stride) {
  int r, c;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);

  for (r = 0; r < rows; r++) {
    for (c = 0; c < cols; c++) {
      diff[c] = src[c] - pred[c];
    }

    diff += diff_stride;
    pred += pred_stride;
    src += src_stride;
  }
}